

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O0

void __thiscall tvm::runtime::WorkspacePool::~WorkspacePool(WorkspacePool *this)

{
  DLDeviceType DVar1;
  Pool *pPVar2;
  TVMContext TVar3;
  reference ppPVar4;
  element_type *device;
  TVMContext ctx;
  size_t i;
  WorkspacePool *this_local;
  
  ctx.device_type = 0;
  ctx.device_id = 0;
  for (; TVar3 = (TVMContext)
                 std::
                 vector<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
                 ::size(&this->array_), (ulong)ctx < (ulong)TVar3; ctx = (TVMContext)((long)ctx + 1)
      ) {
    ppPVar4 = std::
              vector<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
              ::operator[](&this->array_,(size_type)ctx);
    if (*ppPVar4 != (value_type)0x0) {
      DVar1 = this->device_type_;
      ppPVar4 = std::
                vector<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
                ::operator[](&this->array_,(size_type)ctx);
      pPVar2 = *ppPVar4;
      TVar3.device_id = ctx.device_type;
      TVar3.device_type = DVar1;
      device = std::__shared_ptr<tvm::runtime::DeviceAPI,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(this->device_).
                           super___shared_ptr<tvm::runtime::DeviceAPI,_(__gnu_cxx::_Lock_policy)2>);
      Pool::Release(pPVar2,TVar3,device);
      ppPVar4 = std::
                vector<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
                ::operator[](&this->array_,(size_type)ctx);
      pPVar2 = *ppPVar4;
      if (pPVar2 != (Pool *)0x0) {
        Pool::~Pool(pPVar2);
        operator_delete(pPVar2,0x30);
      }
    }
  }
  std::shared_ptr<tvm::runtime::DeviceAPI>::~shared_ptr(&this->device_);
  std::
  vector<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
  ::~vector(&this->array_);
  return;
}

Assistant:

WorkspacePool::~WorkspacePool() {
  for (size_t i = 0; i < array_.size(); ++i) {
    if (array_[i] != nullptr) {
      TVMContext ctx;
      ctx.device_type = device_type_;
      ctx.device_id = static_cast<int>(i);
      array_[i]->Release(ctx, device_.get());
      delete array_[i];
    }
  }
}